

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void google::protobuf::internal::ExtensionSet::RegisterMessageExtension
               (MessageLite *extendee,int number,FieldType type,bool is_repeated,bool is_packed,
               MessageLite *prototype)

{
  bool bVar1;
  LogMessage *other;
  undefined1 local_98 [8];
  ExtensionInfo info;
  LogMessage local_58;
  MessageLite *local_20;
  MessageLite *prototype_local;
  bool is_packed_local;
  bool is_repeated_local;
  FieldType type_local;
  MessageLite *pMStack_10;
  int number_local;
  MessageLite *extendee_local;
  
  bVar1 = false;
  local_20 = prototype;
  prototype_local._1_1_ = is_packed;
  prototype_local._2_1_ = is_repeated;
  prototype_local._3_1_ = type;
  prototype_local._4_4_ = number;
  pMStack_10 = extendee;
  if ((type != '\v') && (type != '\n')) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0xc1);
    bVar1 = true;
    other = LogMessage::operator<<
                      (&local_58,
                       "CHECK failed: type == WireFormatLite::TYPE_MESSAGE || type == WireFormatLite::TYPE_GROUP: "
                      );
    LogFinisher::operator=((LogFinisher *)((long)&info.descriptor + 3),other);
  }
  if (bVar1) {
    LogMessage::~LogMessage(&local_58);
  }
  ExtensionInfo::ExtensionInfo
            ((ExtensionInfo *)local_98,pMStack_10,prototype_local._4_4_,prototype_local._3_1_,
             (bool)(prototype_local._2_1_ & 1),(bool)(prototype_local._1_1_ & 1));
  info._8_8_ = local_20;
  anon_unknown_22::Register((ExtensionInfo *)local_98);
  return;
}

Assistant:

void ExtensionSet::RegisterMessageExtension(const MessageLite* extendee,
                                            int number, FieldType type,
                                            bool is_repeated, bool is_packed,
                                            const MessageLite* prototype) {
  GOOGLE_CHECK(type == WireFormatLite::TYPE_MESSAGE ||
        type == WireFormatLite::TYPE_GROUP);
  ExtensionInfo info(extendee, number, type, is_repeated, is_packed);
  info.message_info = {prototype};
  Register(info);
}